

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_write.c
# Opt level: O0

ares_status_t ares_dns_write_rr_caa(ares_buf_t *buf,ares_dns_rr_t *rr,ares_llist_t **namelist)

{
  size_t sStack_38;
  ares_status_t status;
  size_t data_len;
  uchar *data;
  ares_llist_t **namelist_local;
  ares_dns_rr_t *rr_local;
  ares_buf_t *buf_local;
  
  data_len = 0;
  sStack_38 = 0;
  data = (uchar *)namelist;
  namelist_local = (ares_llist_t **)rr;
  rr_local = (ares_dns_rr_t *)buf;
  buf_local._4_4_ = ares_dns_write_rr_u8(buf,rr,ARES_RR_CAA_CRITICAL);
  if ((buf_local._4_4_ == ARES_SUCCESS) &&
     (buf_local._4_4_ =
           ares_dns_write_rr_str
                     ((ares_buf_t *)rr_local,(ares_dns_rr_t *)namelist_local,ARES_RR_CAA_TAG),
     buf_local._4_4_ == ARES_SUCCESS)) {
    data_len = (size_t)ares_dns_rr_get_bin((ares_dns_rr_t *)namelist_local,ARES_RR_CAA_VALUE,
                                           &stack0xffffffffffffffc8);
    if (((uchar *)data_len == (uchar *)0x0) || (sStack_38 == 0)) {
      buf_local._4_4_ = ARES_EFORMERR;
    }
    else {
      buf_local._4_4_ = ares_buf_append((ares_buf_t *)rr_local,(uchar *)data_len,sStack_38);
    }
  }
  return buf_local._4_4_;
}

Assistant:

static ares_status_t ares_dns_write_rr_caa(ares_buf_t          *buf,
                                           const ares_dns_rr_t *rr,
                                           ares_llist_t       **namelist)
{
  const unsigned char *data     = NULL;
  size_t               data_len = 0;
  ares_status_t        status;

  (void)namelist;

  /* CRITICAL */
  status = ares_dns_write_rr_u8(buf, rr, ARES_RR_CAA_CRITICAL);
  if (status != ARES_SUCCESS) {
    return status; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  /* Tag */
  status = ares_dns_write_rr_str(buf, rr, ARES_RR_CAA_TAG);
  if (status != ARES_SUCCESS) {
    return status; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  /* Value - binary! (remaining buffer */
  data = ares_dns_rr_get_bin(rr, ARES_RR_CAA_VALUE, &data_len);
  if (data == NULL || data_len == 0) {
    return ARES_EFORMERR;
  }

  return ares_buf_append(buf, data, data_len);
}